

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O1

void __thiscall
SGParser::Generator::Production::SetProduction
          (Production *this,String *name,uint left,uint *pright,uint rightCount,size_t line,
          uint prec)

{
  uint *puVar1;
  
  puVar1 = this->pRight;
  if ((puVar1 != (uint *)0x0) && (*puVar1 = *puVar1 - 1, *puVar1 == 0)) {
    operator_delete__(puVar1);
  }
  std::__cxx11::string::_M_assign((string *)this);
  this->Precedence = prec;
  this->Left = left;
  this->Length = rightCount;
  puVar1 = (uint *)operator_new__((ulong)rightCount * 4 + 4);
  this->pRight = puVar1;
  this->Line = line;
  this->NotReported = false;
  *puVar1 = 1;
  if (rightCount != 0) {
    memcpy(puVar1 + 1,pright,(ulong)rightCount << 2);
    return;
  }
  return;
}

Assistant:

void Production::SetProduction(const String& name, unsigned left, const unsigned* pright,
                               unsigned rightCount, size_t line, unsigned prec) {
    // Delete RHS
    if (pRight)
        if (!(--pRight[0u]))
            delete[] pRight;

    Name        = name;
    Precedence  = prec;
    Left        = left;
    Length      = rightCount;
    pRight      = new unsigned[size_t(Length) + 1u];
    Line        = line;
    NotReported = 0u;

    pRight[0u]  = 1u;
    std::copy(pright, pright + Length, pRight + 1u);
}